

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O0

void aom_img_upshift(aom_image_t *dst,aom_image_t *src,int input_shift)

{
  uint *in_RSI;
  aom_image_t *in_stack_00000018;
  aom_image_t *in_stack_00000020;
  
  if ((*in_RSI & 0x800) == 0) {
    lowbd_img_upshift(in_stack_00000020,in_stack_00000018,dst._4_4_);
  }
  else {
    highbd_img_upshift(in_stack_00000020,in_stack_00000018,dst._4_4_);
  }
  return;
}

Assistant:

void aom_img_upshift(aom_image_t *dst, const aom_image_t *src,
                     int input_shift) {
  if (src->fmt & AOM_IMG_FMT_HIGHBITDEPTH) {
    highbd_img_upshift(dst, src, input_shift);
  } else {
    lowbd_img_upshift(dst, src, input_shift);
  }
}